

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O2

void HorizontalFilter_SSE2(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  uint8_t uVar1;
  int iVar2;
  uint8_t *dst;
  long lVar3;
  uint8_t *src;
  
  *filtered_data = *data;
  PredictLineLeft_SSE2(data + 1,filtered_data + 1,width + -1);
  lVar3 = (long)stride;
  src = data + lVar3 + 1;
  dst = filtered_data + 1;
  iVar2 = 1;
  while( true ) {
    dst = dst + lVar3;
    if (height <= iVar2) break;
    uVar1 = *data;
    data = data + lVar3;
    dst[-1] = src[-1] - uVar1;
    PredictLineLeft_SSE2(src,dst,width + -1);
    iVar2 = iVar2 + 1;
    src = src + lVar3;
  }
  return;
}

Assistant:

static void HorizontalFilter_SSE2(const uint8_t* WEBP_RESTRICT data,
                                  int width, int height, int stride,
                                  uint8_t* WEBP_RESTRICT filtered_data) {
  DoHorizontalFilter_SSE2(data, width, height, stride, filtered_data);
}